

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

void __thiscall
GameEngine::populationSplit
          (GameEngine *this,shared_ptr<Population> *population,int32_t destination_x,
          int32_t destination_y)

{
  Population *this_00;
  CellType *this_01;
  Player *this_02;
  int32_t iVar1;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar2;
  shared_ptr<Population> new_population;
  undefined1 local_59;
  Population *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<Population> local_48;
  shared_ptr<Population> local_38;
  
  this_00 = (population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar1 = Population::GetAnimalAmount(this_00);
  Population::SetAnimalAmount(this_00,iVar1 / 2);
  local_58 = (Population *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Population,std::allocator<Population>,Population&>
            (&local_50,&local_58,(allocator<Population> *)&local_59,
             (population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pvVar2 = Map::operator[]((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (long)destination_y);
  this_01 = (pvVar2->
            super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
            )._M_impl.super__Vector_impl_data._M_start[destination_x].
            super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  local_38.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_50._M_pi;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
    }
  }
  CellType::setCurrentPopulation(this_01,&local_38);
  if (local_38.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  Population::SetXPos(local_58,destination_x);
  Population::SetYPos(local_58,destination_y);
  this_02 = (this->players).
            super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
            _M_impl.super__Vector_impl_data._M_start[this->currentPlayer].
            super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  local_48.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_50._M_pi;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
    }
  }
  Player::addNewPopulation(this_02,&local_48);
  if (local_48.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  return;
}

Assistant:

void GameEngine::populationSplit(std::shared_ptr<Population> population, int32_t destination_x, int32_t destination_y) {
  population->SetAnimalAmount(population->GetAnimalAmount() / 2);
  std::shared_ptr<Population> new_population = std::make_shared<Population>(*(population));

  (*map)[destination_y][destination_x]->setCurrentPopulation(new_population);

  new_population->SetXPos(destination_x);
  new_population->SetYPos(destination_y);
  players[currentPlayer]->addNewPopulation(new_population);
}